

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_24a617::ValueSetter::~ValueSetter(ValueSetter *this)

{
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__ValueSetter_002b5730;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->opt);
  std::__cxx11::string::~string((string *)&this->V);
  std::__cxx11::string::~string((string *)&this->DA);
  return;
}

Assistant:

~ValueSetter() override = default;